

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_text64(sqlite3_stmt *pStmt,int i,char *zData,sqlite3_uint64 nData,
                       _func_void_void_ptr *xDel,uchar enc)

{
  int iVar1;
  ulong in_RCX;
  _func_void_void_ptr *in_RDX;
  int in_ESI;
  void *in_RDI;
  void *in_R8;
  undefined1 in_R9B;
  undefined7 unaff_retaddr;
  undefined7 in_stack_ffffffffffffffc8;
  int in_stack_fffffffffffffffc;
  
  if (in_RCX < 0x80000000) {
    iVar1 = bindText((sqlite3_stmt *)CONCAT17(enc,unaff_retaddr),in_stack_fffffffffffffffc,in_RDI,
                     in_ESI,in_RDX,(u8)(in_RCX >> 0x38));
  }
  else {
    iVar1 = invokeValueDestructor
                      (in_R8,(_func_void_void_ptr *)CONCAT17(in_R9B,in_stack_ffffffffffffffc8),
                       (sqlite3_context *)0x1367b1);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_text64( 
  sqlite3_stmt *pStmt, 
  int i, 
  const char *zData, 
  sqlite3_uint64 nData, 
  void (*xDel)(void*),
  unsigned char enc
){
  assert( xDel!=SQLITE_DYNAMIC );
  if( nData>0x7fffffff ){
    return invokeValueDestructor(zData, xDel, 0);
  }else{
    if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
    return bindText(pStmt, i, zData, (int)nData, xDel, enc);
  }
}